

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O2

int WebPValidateDecoderConfig(WebPDecoderConfig *config)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int scaled_height;
  int scaled_width;
  int local_28;
  int local_24;
  uint uVar6;
  
  uVar5 = 0;
  uVar6 = 0;
  if ((((config != (WebPDecoderConfig *)0x0) &&
       (iVar4 = IsValidColorspace((config->output).colorspace), iVar4 != 0)) &&
      ((iVar4 = (config->options).use_cropping, iVar4 == 0 ||
       (((-1 < ((config->options).crop_top | (config->options).crop_left) &&
         (uVar5 = uVar6, 0 < (config->options).crop_width)) && (0 < (config->options).crop_height)))
       ))) && ((iVar1 = (config->options).use_scaling, iVar1 == 0 ||
               ((iVar2 = (config->options).scaled_width, uVar5 = uVar6, -1 < iVar2 &&
                (iVar3 = (config->options).scaled_height, (iVar2 != 0 || iVar3 != 0) && -1 < iVar3))
               )))) {
    iVar2 = (config->input).width;
    if ((0 < iVar2) || (0 < (config->input).height)) {
      _local_28 = CONCAT44((config->options).scaled_width,(config->options).scaled_height);
      if ((iVar4 != 0) &&
         (iVar4 = WebPCheckCropDimensions
                            (iVar2,(config->input).height,(config->options).crop_left,
                             (config->options).crop_top,(config->options).crop_width,
                             (config->options).crop_height), iVar4 == 0)) {
        return 0;
      }
      if ((iVar1 != 0) &&
         (iVar4 = WebPRescalerGetScaledDimensions(iVar2,(config->input).height,&local_24,&local_28),
         iVar4 == 0)) {
        return 0;
      }
    }
    uVar5 = uVar6;
    if ((uint)(config->options).dithering_strength < 0x65) {
      uVar5 = (uint)((uint)(config->options).alpha_dithering_strength < 0x65);
    }
  }
  return uVar5;
}

Assistant:

int WebPValidateDecoderConfig(const WebPDecoderConfig* config) {
  const WebPDecoderOptions* options;
  if (config == NULL) return 0;
  if (!IsValidColorspace(config->output.colorspace)) {
    return 0;
  }

  options = &config->options;
  // bypass_filtering, no_fancy_upsampling, use_cropping, use_scaling,
  // use_threads, flip can be any integer and are interpreted as boolean.

  // Check for cropping.
  if (options->use_cropping && !WebPCheckCropDimensionsBasic(
                                   options->crop_left, options->crop_top,
                                   options->crop_width, options->crop_height)) {
    return 0;
  }
  // Check for scaling.
  if (options->use_scaling &&
      (options->scaled_width < 0 || options->scaled_height < 0 ||
       (options->scaled_width == 0 && options->scaled_height == 0))) {
    return 0;
  }

  // In case the WebPBitstreamFeatures has been filled in, check further.
  if (config->input.width > 0 || config->input.height > 0) {
    int scaled_width = options->scaled_width;
    int scaled_height = options->scaled_height;
    if (options->use_cropping &&
        !WebPCheckCropDimensions(config->input.width, config->input.height,
                                 options->crop_left, options->crop_top,
                                 options->crop_width, options->crop_height)) {
      return 0;
    }
    if (options->use_scaling && !WebPRescalerGetScaledDimensions(
                                    config->input.width, config->input.height,
                                    &scaled_width, &scaled_height)) {
      return 0;
    }
  }

  // Check for dithering.
  if (options->dithering_strength < 0 || options->dithering_strength > 100 ||
      options->alpha_dithering_strength < 0 ||
      options->alpha_dithering_strength > 100) {
    return 0;
  }

  return 1;
}